

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

int CRYPTO_memcmp(void *a,void *b,size_t len)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  
  uVar1 = 0;
  if (0 < (int)len && (b != (void *)0x0 && a != (void *)0x0)) {
    uVar2 = 0;
    bVar3 = 0;
    do {
      bVar3 = bVar3 | *(byte *)((long)b + uVar2) ^ *(byte *)((long)a + uVar2);
      uVar2 = uVar2 + 1;
    } while ((len & 0xffffffff) != uVar2);
    uVar1 = (uint)(bVar3 != 0);
  }
  return uVar1;
}

Assistant:

int CRYPTO_memcmp(const uint8_t *a, const uint8_t *b, int n)
{
    uint8_t r = 0;
    if (a == NULL || b == NULL || n < 0)
        return 0;

    for (int i = 0; i < n; i++) 
        r |= (a[i] ^ b[i]);

    return (r != 0);
}